

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtok.c
# Opt level: O2

int main(void)

{
  undefined4 uVar1;
  char *pcVar2;
  char s [10];
  
  builtin_strncpy(s,"_a_bc__d_",10);
  pcVar2 = strtok(s,"_");
  if (pcVar2 != s + 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x27,"strtok( s, \"_\" ) == &s[1]");
  }
  if (s[1] != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x28,"s[1] == \'a\'");
  }
  if (s[2] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x29,"s[2] == \'\\0\'");
  }
  pcVar2 = strtok((char *)0x0,"_");
  if (pcVar2 != s + 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x2a,"strtok( NULL, \"_\" ) == &s[3]");
  }
  if (s[3] != 'b') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x2b,"s[3] == \'b\'");
  }
  if (s[4] != 'c') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x2c,"s[4] == \'c\'");
  }
  if (s[5] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x2d,"s[5] == \'\\0\'");
  }
  pcVar2 = strtok((char *)0x0,"_");
  if (pcVar2 != s + 7) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x2e,"strtok( NULL, \"_\" ) == &s[7]");
  }
  if (s[6] != '_') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x2f,"s[6] == \'_\'");
  }
  if (s[7] != 'd') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x30,"s[7] == \'d\'");
  }
  if (s[8] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x31,"s[8] == \'\\0\'");
  }
  pcVar2 = strtok((char *)0x0,"_");
  if (pcVar2 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x32,"strtok( NULL, \"_\" ) == NULL");
  }
  builtin_strncpy(s,"ab_cd",6);
  uVar1 = s._0_4_;
  s._0_8_ = CONCAT44(s._4_4_,uVar1);
  pcVar2 = strtok(s,"_");
  if (pcVar2 != s) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x34,"strtok( s, \"_\" ) == &s[0]");
  }
  if (s[0] != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x35,"s[0] == \'a\'");
  }
  if (s[1] != 'b') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x36,"s[1] == \'b\'");
  }
  if (s[2] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x37,"s[2] == \'\\0\'");
  }
  pcVar2 = strtok((char *)0x0,"_");
  if (pcVar2 != s + 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x38,"strtok( NULL, \"_\" ) == &s[3]");
  }
  if (s[3] != 'c') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x39,"s[3] == \'c\'");
  }
  if (s[4] != 'd') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x3a,"s[4] == \'d\'");
  }
  if (s[5] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x3b,"s[5] == \'\\0\'");
  }
  pcVar2 = strtok((char *)0x0,"_");
  if (pcVar2 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strtok.c, line %d - %s\n"
           ,0x3c,"strtok( NULL, \"_\" ) == NULL");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char s[] = "_a_bc__d_";
    TESTCASE( strtok( s, "_" ) == &s[1] );
    TESTCASE( s[1] == 'a' );
    TESTCASE( s[2] == '\0' );
    TESTCASE( strtok( NULL, "_" ) == &s[3] );
    TESTCASE( s[3] == 'b' );
    TESTCASE( s[4] == 'c' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( strtok( NULL, "_" ) == &s[7] );
    TESTCASE( s[6] == '_' );
    TESTCASE( s[7] == 'd' );
    TESTCASE( s[8] == '\0' );
    TESTCASE( strtok( NULL, "_" ) == NULL );
    strcpy( s, "ab_cd" );
    TESTCASE( strtok( s, "_" ) == &s[0] );
    TESTCASE( s[0] == 'a' );
    TESTCASE( s[1] == 'b' );
    TESTCASE( s[2] == '\0' );
    TESTCASE( strtok( NULL, "_" ) == &s[3] );
    TESTCASE( s[3] == 'c' );
    TESTCASE( s[4] == 'd' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( strtok( NULL, "_" ) == NULL );
    return TEST_RESULTS;
}